

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O3

bool __thiscall Func::DoSimpleJitDynamicProfile(Func *this)

{
  ExecutionMode EVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  
  EVar1 = JITTimeWorkItem::GetJitMode(this->m_workItem);
  if (EVar1 == SimpleJit) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
    this_01 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015a4e90,SimpleJitDynamicProfilePhase,sourceContextId,
                       functionId);
    if (!bVar2) {
      return (bool)(DAT_015a4e4c ^ 1);
    }
  }
  return false;
}

Assistant:

bool
Func::DoSimpleJitDynamicProfile() const
{
    return IsSimpleJit() && !PHASE_OFF(Js::SimpleJitDynamicProfilePhase, GetTopFunc()) && !CONFIG_FLAG(NewSimpleJit);
}